

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QNetworkAddressEntry *entry)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  QDebug *pQVar4;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff58;
  Stream *this;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QDebug local_60;
  QDebug in_stack_ffffffffffffffa8;
  QDebug local_40;
  QDebug local_38 [3];
  QDebug local_20;
  QDebug local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  pQVar4 = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(pQVar4);
  pQVar4 = QDebug::operator<<((QDebug *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                              (char *)in_stack_ffffffffffffffa8.stream);
  QDebug::QDebug(&local_20,pQVar4);
  QNetworkAddressEntry::ip((QNetworkAddressEntry *)this);
  operator<<(in_RDX,(QHostAddress *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  QDebug::~QDebug(&local_18);
  QHostAddress::~QHostAddress((QHostAddress *)0x23f955);
  QDebug::~QDebug(&local_20);
  QNetworkAddressEntry::netmask
            ((QNetworkAddressEntry *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar1 = QHostAddress::isNull((QHostAddress *)0x23f97b);
  bVar2 = bVar1 ^ 0xff;
  QHostAddress::~QHostAddress((QHostAddress *)0x23f98b);
  if ((bVar2 & 1) != 0) {
    pQVar4 = QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_ffffffffffffff78),
                                (char *)in_stack_ffffffffffffffa8.stream);
    QDebug::QDebug(&local_40,pQVar4);
    QNetworkAddressEntry::netmask((QNetworkAddressEntry *)CONCAT17(bVar2,in_stack_ffffffffffffff78))
    ;
    operator<<(in_RDX,(QHostAddress *)CONCAT17(bVar2,in_stack_ffffffffffffff78));
    QDebug::~QDebug(local_38);
    QHostAddress::~QHostAddress((QHostAddress *)0x23f9ea);
    QDebug::~QDebug(&local_40);
  }
  QNetworkAddressEntry::broadcast((QNetworkAddressEntry *)this);
  bVar1 = QHostAddress::isNull((QHostAddress *)0x23fa0d);
  bVar3 = bVar1 ^ 0xff;
  QHostAddress::~QHostAddress((QHostAddress *)0x23fa1d);
  if ((bVar3 & 1) != 0) {
    pQVar4 = QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_ffffffffffffff78),
                                (char *)in_stack_ffffffffffffffa8.stream);
    QDebug::QDebug(&local_60,pQVar4);
    QNetworkAddressEntry::broadcast((QNetworkAddressEntry *)this);
    operator<<(in_RDX,(QHostAddress *)CONCAT17(bVar2,in_stack_ffffffffffffff78));
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffa8);
    QHostAddress::~QHostAddress((QHostAddress *)0x23fa7c);
    QDebug::~QDebug(&local_60);
  }
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)CONCAT17(bVar3,in_stack_ffffffffffffff58));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkAddressEntry &entry)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "address = " << entry.ip();
    if (!entry.netmask().isNull())
        debug << ", netmask = " << entry.netmask();
    if (!entry.broadcast().isNull())
        debug << ", broadcast = " << entry.broadcast();
    return debug;
}